

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_GetTransactionDataByHandle_Test::TestBody
          (cfdcapi_elements_transaction_GetTransactionDataByHandle_Test *this)

{
  bool bVar1;
  char *in_R9;
  char *pcVar2;
  uint32_t weight;
  undefined4 uStack_c4;
  char *asset_value;
  char *wtxid;
  char *script_sig;
  char *token_value;
  int ret;
  AssertionResult gtest_ar;
  undefined1 local_88 [16];
  uint32_t vsize;
  undefined4 uStack_74;
  char *wit_hash;
  AssertionResult gtest_ar_;
  uint32_t version;
  void *tx_handle;
  void *handle;
  uint32_t size;
  uint32_t sequence;
  uint32_t vout;
  uint32_t txout_count;
  uint32_t txin_count;
  uint32_t locktime;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,500,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_handle);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1f5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&tx_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_88) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_handle != (void *)0x0)) {
        (**(code **)(*tx_handle + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  txin_count = 0;
  txout_count = 0;
  tx_handle = (void *)0x0;
  ret = CfdInitializeTxDataHandle
                  (handle,0xb,
                   "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                   ,&tx_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = tx_handle != handle;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (tx_handle == handle) {
    testing::Message::Message((Message *)&script_sig);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(tx_handle == handle)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&wtxid,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1ff,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&wtxid,(Message *)&script_sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wtxid);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_88) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (script_sig != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (script_sig != (char *)0x0)) {
        (**(code **)(*(long *)script_sig + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (ret == 0) {
    ret = CfdGetTxInCountByHandle(handle,tx_handle,&txin_count);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&script_sig,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x202,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&gtest_ar,"2","txin_count",(int *)&gtest_ar_,&txin_count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&script_sig,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x203,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetTxOutCountByHandle(handle,tx_handle,&txout_count);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&script_sig,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x206,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&gtest_ar,"4","txout_count",(int *)&gtest_ar_,&txout_count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&script_sig,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x207,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    script_sig = (char *)0x0;
    vout = 0;
    sequence = 0;
    if (ret == 0) {
      wtxid = (char *)0x0;
      wit_hash = (char *)0x0;
      _size = (char *)((ulong)_size & 0xffffffff00000000);
      _vsize = _vsize & 0xffffffff00000000;
      weight = 0;
      version = 0;
      locktime = 0;
      ret = CfdGetConfidentialTxInfoByHandle
                      (handle,tx_handle,(char **)&gtest_ar_,&wtxid,&wit_hash,&size,&vsize,&weight,
                       &version,&locktime);
      asset_value = (char *)((ulong)asset_value & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&asset_value,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&asset_value);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&token_value,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x218,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&token_value,(Message *)&asset_value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
        if (asset_value != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (asset_value != (char *)0x0)) {
            (**(code **)(*(long *)asset_value + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,
                   "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","txid",
                   "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",
                   (char *)gtest_ar_._0_8_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,
                   "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","wtxid",
                   "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",wtxid);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,
                   "\"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8\"","wit_hash"
                   ,"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8",wit_hash);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21c,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        asset_value = (char *)CONCAT44(asset_value._4_4_,0x200);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"512","size",(int *)&asset_value,&size);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21d,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        asset_value = (char *)CONCAT44(asset_value._4_4_,0x200);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"512","vsize",(int *)&asset_value,&vsize);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        asset_value = (char *)CONCAT44(asset_value._4_4_,0x800);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"2048","weight",(int *)&asset_value,&weight);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21f,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        asset_value = (char *)CONCAT44(asset_value._4_4_,2);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"2","version",(int *)&asset_value,&version);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x220,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        asset_value = (char *)((ulong)asset_value & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"0","locktime",(int *)&asset_value,&locktime);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&asset_value);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&token_value,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x221,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&token_value,(Message *)&asset_value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token_value);
          if (asset_value != (char *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (asset_value != (char *)0x0)) {
              (**(code **)(*(long *)asset_value + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
        CfdFreeStringBuffer(wtxid);
        CfdFreeStringBuffer(wit_hash);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (ret == 0) {
          ret = CfdGetTxInByHandle(handle,tx_handle,1,(char **)&gtest_ar_,&vout,&sequence,
                                   &script_sig);
          wtxid = (char *)((ulong)wtxid & 0xffffffff00000000);
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&wtxid,&ret);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&wtxid);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&wit_hash,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x22c,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&wit_hash,(Message *)&wtxid);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
            if (wtxid != (char *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (wtxid != (char *)0x0)) {
                (**(code **)(*(long *)wtxid + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (ret == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&gtest_ar,
                       "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"","txid"
                       ,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
                       (char *)gtest_ar_._0_8_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&wtxid);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&wit_hash,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x22e,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&wit_hash,(Message *)&wtxid);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
              if (wtxid != (char *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (wtxid != (char *)0x0)) {
                  (**(code **)(*(long *)wtxid + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            wtxid = (char *)CONCAT44(wtxid._4_4_,1);
            testing::internal::CmpHelperEQ<int,unsigned_int>
                      ((internal *)&gtest_ar,"1","vout",(int *)&wtxid,&vout);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&wtxid);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&wit_hash,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x22f,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&wit_hash,(Message *)&wtxid);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
              if (wtxid != (char *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (wtxid != (char *)0x0)) {
                  (**(code **)(*(long *)wtxid + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            pcVar2 = "";
            testing::internal::CmpHelperSTREQ
                      ((internal *)&gtest_ar,"\"\"","script_sig","",script_sig);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&wtxid);
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&wit_hash,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x230,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&wit_hash,(Message *)&wtxid);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
              if (wtxid != (char *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (wtxid != (char *)0x0)) {
                  (**(code **)(*(long *)wtxid + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            wtxid = (char *)CONCAT44(wtxid._4_4_,0xffffffff);
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_ar,"4294967295U","sequence",(uint *)&wtxid,&sequence);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&wtxid);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&wit_hash,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x231,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&wit_hash,(Message *)&wtxid);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
              if (wtxid != (char *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (wtxid != (char *)0x0)) {
                  (**(code **)(*(long *)wtxid + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
            CfdFreeStringBuffer(script_sig);
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            script_sig = (char *)0x0;
            if (ret == 0) {
              wtxid = (char *)0x0;
              wit_hash = (char *)0x0;
              asset_value = (char *)0x0;
              token_value = (char *)0x0;
              _size = (char *)0x0;
              _vsize = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
              ret = CfdGetTxInIssuanceInfoByHandle
                              (handle,tx_handle,1,&wtxid,&wit_hash,(int64_t *)&size,&asset_value,
                               (int64_t *)&vsize,&token_value,(char **)0x0,(char **)0x0);
              weight = 0;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&weight,&ret);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&weight);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&version,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x243,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&version,(Message *)&weight);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                if (CONCAT44(uStack_c4,weight) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (ret == 0) {
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,
                           "\"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306\"",
                           "entropy",
                           "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",wtxid)
                ;
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x245,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,
                           "\"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8\"",
                           "nonce",
                           "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
                           wit_hash);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x246,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,"\"010000000023c34600\"","asset_value",
                           "010000000023c34600",asset_value);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x247,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                pcVar2 = "";
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,"\"\"","token_value","",token_value);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x248,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                weight = 600000000;
                testing::internal::CmpHelperEQ<int,long>
                          ((internal *)&gtest_ar,"600000000","asset_amount",(int *)&weight,
                           (long *)&size);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x249,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                weight = 0;
                testing::internal::CmpHelperEQ<int,long>
                          ((internal *)&gtest_ar,"0","token_amount",(int *)&weight,(long *)&vsize);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&weight);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&version,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x24a,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&version,(Message *)&weight);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&version);
                  if (CONCAT44(uStack_c4,weight) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)CONCAT44(uStack_c4,weight) != (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(uStack_c4,weight) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                CfdFreeStringBuffer(wtxid);
                CfdFreeStringBuffer(wit_hash);
                CfdFreeStringBuffer(asset_value);
                CfdFreeStringBuffer(token_value);
                if (ret == 0) {
                  wtxid = (char *)0x0;
                  wit_hash = (char *)0x0;
                  asset_value = (char *)0x0;
                  token_value = (char *)0x0;
                  _size = (char *)0x0;
                  ret = CfdGetConfidentialTxOutSimpleByHandle
                                  (handle,tx_handle,3,&wtxid,(int64_t *)&wit_hash,&asset_value,
                                   &token_value,(char **)&size);
                  _vsize = _vsize & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<CfdErrorCode,int>
                            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&vsize,&ret);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&vsize);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&weight,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x25c,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&weight,(Message *)&vsize);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                    if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0)) {
                        (**(code **)(*(long *)_vsize + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&gtest_ar.message_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  if (ret == 0) {
                    testing::internal::CmpHelperSTREQ
                              ((internal *)&gtest_ar,
                               "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\""
                               ,"asset_string",
                               "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                               wtxid);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&vsize);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&weight,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x25e,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&weight,(Message *)&vsize);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                      if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0)) {
                          (**(code **)(*(long *)_vsize + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    testing::internal::CmpHelperSTREQ
                              ((internal *)&gtest_ar,"\"010000000023c34600\"","value_commitment",
                               "010000000023c34600",asset_value);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&vsize);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&weight,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x25f,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&weight,(Message *)&vsize);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                      if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0)) {
                          (**(code **)(*(long *)_vsize + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    testing::internal::CmpHelperSTREQ
                              ((internal *)&gtest_ar,
                               "\"03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879\""
                               ,"nonce",
                               "03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879",
                               token_value);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&vsize);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&weight,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x260,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&weight,(Message *)&vsize);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                      if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0)) {
                          (**(code **)(*(long *)_vsize + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    testing::internal::CmpHelperSTREQ
                              ((internal *)&gtest_ar,
                               "\"76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac\"",
                               "locking_script","76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac"
                               ,_size);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&vsize);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&weight,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x261,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&weight,(Message *)&vsize);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                      if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0)) {
                          (**(code **)(*(long *)_vsize + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    vsize = 600000000;
                    testing::internal::CmpHelperEQ<int,long>
                              ((internal *)&gtest_ar,"600000000","value_satoshi",(int *)&vsize,
                               (long *)&wit_hash);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&vsize);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&weight,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x262,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&weight,(Message *)&vsize);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&weight);
                      if (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) &&
                           (_vsize != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0)) {
                          (**(code **)(*(long *)_vsize + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    CfdFreeStringBuffer(wtxid);
                    CfdFreeStringBuffer(asset_value);
                    CfdFreeStringBuffer(token_value);
                    CfdFreeStringBuffer(_size);
                  }
                }
              }
            }
          }
        }
      }
    }
    ret = CfdFreeTxDataHandle(handle,tx_handle);
    wtxid = (char *)((ulong)wtxid & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&wtxid,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&wtxid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&wit_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x26c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&wit_hash,(Message *)&wtxid);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wit_hash);
      if (wtxid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (wtxid != (char *)0x0)) {
          (**(code **)(*(long *)wtxid + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&gtest_ar_);
    script_sig = (char *)((ulong)script_sig & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&script_sig,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&script_sig);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&wtxid,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x273,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&wtxid,(Message *)&script_sig);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wtxid);
      if (script_sig != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (script_sig != (char *)0x0)) {
          (**(code **)(*(long *)script_sig + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)gtest_ar_._0_8_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&script_sig);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&wtxid,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x274,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&wtxid,(Message *)&script_sig);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wtxid);
      if (script_sig != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (script_sig != (char *)0x0)) {
          (**(code **)(*(long *)script_sig + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&script_sig,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script_sig);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetTransactionDataByHandle) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  uint32_t txin_count = 0;
  uint32_t txout_count = 0;

  void* tx_handle = NULL;
  ret = CfdInitializeTxDataHandle(handle, kCfdNetworkElementsRegtest, tx_data, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((tx_handle == handle));
  if (ret == kCfdSuccess) {
    ret = CfdGetTxInCountByHandle(handle, tx_handle, &txin_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, txin_count);

    ret = CfdGetTxOutCountByHandle(handle, tx_handle, &txout_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(4, txout_count);

    char* txid = nullptr;
    char* script_sig = nullptr;
    uint32_t vout = 0;
    uint32_t sequence = 0;
    if (ret == kCfdSuccess) {
      char* wtxid = nullptr;
      char* wit_hash = nullptr;
      uint32_t size = 0;
      uint32_t vsize = 0;
      uint32_t weight = 0;
      uint32_t version = 0;
      uint32_t locktime = 0;
      ret = CfdGetConfidentialTxInfoByHandle(
          handle, tx_handle, &txid, &wtxid, &wit_hash, &size, &vsize, &weight,
          &version, &locktime);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", txid);
        EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", wtxid);
        EXPECT_STREQ("938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8", wit_hash);
        EXPECT_EQ(512, size);
        EXPECT_EQ(512, vsize);
        EXPECT_EQ(2048, weight);
        EXPECT_EQ(2, version);
        EXPECT_EQ(0, locktime);

        CfdFreeStringBuffer(txid);
        CfdFreeStringBuffer(wtxid);
        CfdFreeStringBuffer(wit_hash);
        txid = nullptr;
      }
    }
    if (ret == kCfdSuccess) {
      ret = CfdGetTxInByHandle(
          handle, tx_handle, 1, &txid, &vout, &sequence, &script_sig);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", txid);
        EXPECT_EQ(1, vout);
        EXPECT_STREQ("", script_sig);
        EXPECT_EQ(4294967295U, sequence);

        CfdFreeStringBuffer(txid);
        CfdFreeStringBuffer(script_sig);
        txid = nullptr;
        script_sig = nullptr;
      }
    }
    if (ret == kCfdSuccess) {
      char* entropy = nullptr;
      char* nonce = nullptr;
      char* asset_value = nullptr;
      char* token_value = nullptr;
      int64_t asset_amount = 0;
      int64_t token_amount = 0;
      ret = CfdGetTxInIssuanceInfoByHandle(
          handle, tx_handle, 1, &entropy, &nonce, &asset_amount, &asset_value,
          &token_amount, &token_value, nullptr, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306", entropy);
        EXPECT_STREQ("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8", nonce);
        EXPECT_STREQ("010000000023c34600", asset_value);
        EXPECT_STREQ("", token_value);
        EXPECT_EQ(600000000, asset_amount);
        EXPECT_EQ(0, token_amount);

        CfdFreeStringBuffer(entropy);
        CfdFreeStringBuffer(nonce);
        CfdFreeStringBuffer(asset_value);
        CfdFreeStringBuffer(token_value);
      }
    }

    if (ret == kCfdSuccess) {
      char* asset_string = nullptr;
      int64_t value_satoshi = 0;
      char* value_commitment = nullptr;
      char* nonce = nullptr;
      char* locking_script = nullptr;
      ret = CfdGetConfidentialTxOutSimpleByHandle(
          handle, tx_handle, 3, &asset_string, &value_satoshi, &value_commitment,
          &nonce, &locking_script);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
        EXPECT_STREQ("010000000023c34600", value_commitment);
        EXPECT_STREQ("03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879", nonce);
        EXPECT_STREQ("76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac", locking_script);
        EXPECT_EQ(600000000, value_satoshi);

        CfdFreeStringBuffer(asset_string);
        CfdFreeStringBuffer(value_commitment);
        CfdFreeStringBuffer(nonce);
        CfdFreeStringBuffer(locking_script);
      }
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}